

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindAllFileNames
          (DescriptorIndex *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  pointer pFVar1;
  bool bVar2;
  reference pFVar3;
  long lVar4;
  FileEntry *entry;
  pointer pFVar5;
  const_iterator cVar6;
  allocator<char> local_89;
  DescriptorIndex *local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  const_iterator local_60;
  string local_50 [32];
  
  local_88 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(output,((long)(this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->by_name_flat_).
                        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28 +
                  (this->by_name_).
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                  .
                  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                  .tree_.size_);
  cVar6 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   *)&this->by_name_);
  local_80._M_len = (size_t)cVar6.node_;
  local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,cVar6.position_);
  cVar6 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                 *)&this->by_name_);
  local_60.node_ = cVar6.node_;
  local_60.position_ = cVar6.position_;
  lVar4 = 0;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
            ::operator!=((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                          *)&local_80,&local_60);
    if (!bVar2) break;
    pFVar3 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
             ::operator*((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                          *)&local_80);
    local_70._M_str = (pFVar3->encoded_name)._M_dataplus._M_p;
    local_70._M_len = (pFVar3->encoded_name)._M_string_length;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,&local_70,&local_89);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((output->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
               local_50);
    std::__cxx11::string::~string(local_50);
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
    ::increment((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                 *)&local_80);
    lVar4 = lVar4 + 0x20;
  }
  pFVar1 = (local_88->by_name_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar5 = (local_88->by_name_flat_).
                super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar1; pFVar5 = pFVar5 + 1) {
    local_80._M_str = (pFVar5->encoded_name)._M_dataplus._M_p;
    local_80._M_len = (pFVar5->encoded_name)._M_string_length;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,&local_80,(allocator<char> *)&local_60);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((output->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
               local_50);
    std::__cxx11::string::~string(local_50);
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void EncodedDescriptorDatabase::DescriptorIndex::FindAllFileNames(
    std::vector<std::string>* PROTOBUF_NONNULL output) const {
  output->resize(by_name_.size() + by_name_flat_.size());
  int i = 0;
  for (const auto& entry : by_name_) {
    (*output)[i] = std::string(entry.name(*this));
    i++;
  }
  for (const auto& entry : by_name_flat_) {
    (*output)[i] = std::string(entry.name(*this));
    i++;
  }
}